

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::RoundWeedCounted
               (Vector<char> buffer,int length,uint64_t rest,uint64_t ten_kappa,uint64_t unit,
               int *kappa)

{
  char *pcVar1;
  ulong in_RCX;
  int in_EDX;
  ulong in_R8;
  ulong in_R9;
  int *in_stack_00000008;
  int i;
  int local_3c;
  Vector<char> local_18;
  bool local_1;
  
  if (in_R9 < in_R8) {
    if (in_R9 < in_R8 - in_R9) {
      if ((in_RCX < in_R8 - in_RCX) && (in_R9 << 1 <= in_R8 + in_RCX * -2)) {
        local_1 = true;
      }
      else if ((in_R9 < in_RCX) && (in_R8 - (in_RCX - in_R9) <= in_RCX - in_R9)) {
        pcVar1 = Vector<char>::operator[](&local_18,in_EDX + -1);
        *pcVar1 = *pcVar1 + '\x01';
        local_3c = in_EDX + -1;
        while ((0 < local_3c &&
               (pcVar1 = Vector<char>::operator[](&local_18,local_3c), *pcVar1 == ':'))) {
          pcVar1 = Vector<char>::operator[](&local_18,local_3c);
          *pcVar1 = '0';
          pcVar1 = Vector<char>::operator[](&local_18,local_3c + -1);
          *pcVar1 = *pcVar1 + '\x01';
          local_3c = local_3c + -1;
        }
        pcVar1 = Vector<char>::operator[](&local_18,0);
        if (*pcVar1 == ':') {
          pcVar1 = Vector<char>::operator[](&local_18,0);
          *pcVar1 = '1';
          *in_stack_00000008 = *in_stack_00000008 + 1;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool RoundWeedCounted(Vector<char> buffer,
                             int length,
                             uint64_t rest,
                             uint64_t ten_kappa,
                             uint64_t unit,
                             int* kappa) {
  DOUBLE_CONVERSION_ASSERT(rest < ten_kappa);
  // The following tests are done in a specific order to avoid overflows. They
  // will work correctly with any uint64 values of rest < ten_kappa and unit.
  //
  // If the unit is too big, then we don't know which way to round. For example
  // a unit of 50 means that the real number lies within rest +/- 50. If
  // 10^kappa == 40 then there is no way to tell which way to round.
  if (unit >= ten_kappa) return false;
  // Even if unit is just half the size of 10^kappa we are already completely
  // lost. (And after the previous test we know that the expression will not
  // over/underflow.)
  if (ten_kappa - unit <= unit) return false;
  // If 2 * (rest + unit) <= 10^kappa we can safely round down.
  if ((ten_kappa - rest > rest) && (ten_kappa - 2 * rest >= 2 * unit)) {
    return true;
  }
  // If 2 * (rest - unit) >= 10^kappa, then we can safely round up.
  if ((rest > unit) && (ten_kappa - (rest - unit) <= (rest - unit))) {
    // Increment the last digit recursively until we find a non '9' digit.
    buffer[length - 1]++;
    for (int i = length - 1; i > 0; --i) {
      if (buffer[i] != '0' + 10) break;
      buffer[i] = '0';
      buffer[i - 1]++;
    }
    // If the first digit is now '0'+ 10 we had a buffer with all '9's. With the
    // exception of the first digit all digits are now '0'. Simply switch the
    // first digit to '1' and adjust the kappa. Example: "99" becomes "10" and
    // the power (the kappa) is increased.
    if (buffer[0] == '0' + 10) {
      buffer[0] = '1';
      (*kappa) += 1;
    }
    return true;
  }
  return false;
}